

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-matchers.h
# Opt level: O2

bool __thiscall
testing::internal::AllOfMatcherImpl<const_char_&>::MatchAndExplain
          (AllOfMatcherImpl<const_char_&> *this,char *x,MatchResultListener *listener)

{
  bool bVar1;
  ulong uVar2;
  long lVar3;
  ulong uVar4;
  string all_match_result;
  string result;
  StringMatchResultListener slistener;
  
  all_match_result._M_dataplus._M_p = (pointer)&all_match_result.field_2;
  all_match_result._M_string_length = 0;
  all_match_result.field_2._M_local_buf[0] = '\0';
  uVar4 = 0xffffffffffffffff;
  lVar3 = 0;
  do {
    uVar2 = ((long)(this->matchers_).
                   super__Vector_base<testing::Matcher<const_char_&>,_std::allocator<testing::Matcher<const_char_&>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
            (long)(this->matchers_).
                  super__Vector_base<testing::Matcher<const_char_&>,_std::allocator<testing::Matcher<const_char_&>_>_>
                  ._M_impl.super__Vector_impl_data._M_start) / 0x18;
    uVar4 = uVar4 + 1;
    if (uVar2 <= uVar4) {
      MatchResultListener::operator<<(listener,&all_match_result);
      break;
    }
    StringMatchResultListener::StringMatchResultListener(&slistener);
    bVar1 = MatcherBase<const_char_&>::MatchAndExplain
                      ((MatcherBase<const_char_&> *)
                       ((long)&(((this->matchers_).
                                 super__Vector_base<testing::Matcher<const_char_&>,_std::allocator<testing::Matcher<const_char_&>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->
                               super_MatcherBase<const_char_&>).super_MatcherDescriberInterface.
                               _vptr_MatcherDescriberInterface + lVar3),x,
                       &slistener.super_MatchResultListener);
    if (bVar1) {
      if (all_match_result._M_string_length == 0) {
        std::__cxx11::stringbuf::str();
        std::__cxx11::string::operator=((string *)&all_match_result,(string *)&result);
      }
      else {
        std::__cxx11::stringbuf::str();
        if (result._M_string_length != 0) {
          std::__cxx11::string::append((char *)&all_match_result);
          std::__cxx11::string::append((string *)&all_match_result);
        }
      }
    }
    else {
      std::__cxx11::stringbuf::str();
      MatchResultListener::operator<<(listener,&result);
    }
    std::__cxx11::string::~string((string *)&result);
    lVar3 = lVar3 + 0x18;
    StringMatchResultListener::~StringMatchResultListener(&slistener);
  } while (bVar1);
  std::__cxx11::string::~string((string *)&all_match_result);
  return uVar2 <= uVar4;
}

Assistant:

bool MatchAndExplain(const T& x,
                       MatchResultListener* listener) const override {
    // If either matcher1_ or matcher2_ doesn't match x, we only need
    // to explain why one of them fails.
    std::string all_match_result;

    for (size_t i = 0; i < matchers_.size(); ++i) {
      StringMatchResultListener slistener;
      if (matchers_[i].MatchAndExplain(x, &slistener)) {
        if (all_match_result.empty()) {
          all_match_result = slistener.str();
        } else {
          std::string result = slistener.str();
          if (!result.empty()) {
            all_match_result += ", and ";
            all_match_result += result;
          }
        }
      } else {
        *listener << slistener.str();
        return false;
      }
    }

    // Otherwise we need to explain why *both* of them match.
    *listener << all_match_result;
    return true;
  }